

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall xercesc_4_0::CMStateSet::setBit(CMStateSet *this,XMLSize_t bitToSet)

{
  XMLInt32 *pXVar1;
  ArrayIndexOutOfBoundsException *pAVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  XMLSize_t byteOfs_1;
  XMLSize_t index;
  XMLSize_t vectorOfs;
  XMLSize_t byteOfs;
  XMLInt32 mask;
  XMLSize_t bitToSet_local;
  CMStateSet *this_local;
  
  if (bitToSet < this->fBitCount) {
    uVar3 = (uint)(1L << ((byte)bitToSet & 0x1f));
    if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
      uVar4 = bitToSet >> 5;
      this->fBits[uVar4] = (uVar3 ^ 0xffffffff) & this->fBits[uVar4];
      this->fBits[uVar4] = uVar3 | this->fBits[uVar4];
    }
    else {
      uVar4 = bitToSet >> 10;
      if (this->fDynamicBuffer->fBitArray[uVar4] == (XMLInt32 *)0x0) {
        allocateChunk(this,uVar4);
        for (byteOfs_1 = 0; byteOfs_1 < 0x20; byteOfs_1 = byteOfs_1 + 1) {
          this->fDynamicBuffer->fBitArray[uVar4][byteOfs_1] = 0;
        }
      }
      uVar5 = (bitToSet & 0x3ff) >> 5;
      pXVar1 = this->fDynamicBuffer->fBitArray[uVar4];
      pXVar1[uVar5] = (uVar3 ^ 0xffffffff) & pXVar1[uVar5];
      pXVar1 = this->fDynamicBuffer->fBitArray[uVar4];
      pXVar1[uVar5] = uVar3 | pXVar1[uVar5];
    }
    return;
  }
  if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
    pAVar2 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (pAVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x1a5,Bitset_BadIndex,(MemoryManager *)0x0);
    __cxa_throw(pAVar2,&ArrayIndexOutOfBoundsException::typeinfo,
                ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
  }
  pAVar2 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
            (pAVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
             ,0x1a3,Bitset_BadIndex,this->fDynamicBuffer->fMemoryManager);
  __cxa_throw(pAVar2,&ArrayIndexOutOfBoundsException::typeinfo,
              ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
}

Assistant:

void setBit(const XMLSize_t bitToSet)
    {
        if (bitToSet >= fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex);
        }

        const XMLInt32 mask = 1UL << (bitToSet % 32);

        // And access the right bit and byte
        if(fDynamicBuffer==0)
        {
            const XMLSize_t byteOfs = bitToSet / 32;
            fBits[byteOfs] &= ~mask;
            fBits[byteOfs] |= mask;
        }
        else
        {
            const XMLSize_t vectorOfs = bitToSet / CMSTATE_BITFIELD_CHUNK;
            if(fDynamicBuffer->fBitArray[vectorOfs]==NULL)
            {
                allocateChunk(vectorOfs);
                for(XMLSize_t index=0;index < CMSTATE_BITFIELD_INT32_SIZE; index++)
                    fDynamicBuffer->fBitArray[vectorOfs][index]=0;
            }
            const XMLSize_t byteOfs = (bitToSet % CMSTATE_BITFIELD_CHUNK) / 32;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] &= ~mask;
            fDynamicBuffer->fBitArray[vectorOfs][byteOfs] |= mask;
        }
    }